

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

void __thiscall
kj::ExceptionCallback::RootExceptionCallback::logException
          (RootExceptionCallback *this,LogSeverity severity,Exception *e)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  ArrayPtr<void_*const> trace;
  size_t sVar4;
  ExceptionCallback *pEVar5;
  void **ppvVar6;
  ulong uVar7;
  char (*in_stack_ffffffffffffff48) [2];
  Type local_ac;
  String local_a8;
  String local_88;
  String local_68;
  StringPtr local_50;
  
  pEVar5 = getExceptionCallback();
  pcVar2 = e->file;
  uVar1 = e->line;
  local_ac = e->type;
  uVar3 = (e->description).content.size_;
  ppvVar6 = (void **)0x199111;
  if (uVar3 != 0) {
    ppvVar6 = (void **)(e->description).content.ptr;
  }
  uVar7 = 1;
  if (1 < uVar3) {
    uVar7 = uVar3;
  }
  local_50.content.size_ = 0x191174;
  if (1 >= uVar3) {
    local_50.content.size_ = 0x199111;
  }
  local_a8.content.ptr = (char *)e->trace;
  local_a8.content.size_ = (size_t)e->traceCount;
  local_50.content.ptr = "\nstack: ";
  if ((char *)local_a8.content.size_ == (char *)0x0) {
    local_50.content.ptr = "";
  }
  strArray<kj::ArrayPtr<void*const>&>
            (&local_88,(kj *)&local_a8,(ArrayPtr<void_*const> *)0x197484,
             (char *)local_a8.content.size_);
  trace.size_ = uVar7;
  trace.ptr = ppvVar6;
  stringifyStackTrace(trace);
  str<kj::Exception::Type,char_const*,kj::StringPtr,char_const*,kj::String,kj::String,char_const(&)[2]>
            (&local_68,(kj *)&local_ac,(Type *)&local_50.content.size_,
             (char **)&stack0xffffffffffffffc0,&local_50,(char **)&local_88,&local_a8,
             (String *)0x199110,in_stack_ffffffffffffff48);
  (*pEVar5->_vptr_ExceptionCallback[4])(pEVar5,severity,pcVar2,(ulong)uVar1,0,&local_68);
  sVar4 = local_68.content.size_;
  pcVar2 = local_68.content.ptr;
  if (local_68.content.ptr != (char *)0x0) {
    local_68.content.ptr = (char *)0x0;
    local_68.content.size_ = 0;
    (**(local_68.content.disposer)->_vptr_ArrayDisposer)
              (local_68.content.disposer,pcVar2,1,sVar4,sVar4,0);
  }
  sVar4 = local_a8.content.size_;
  pcVar2 = local_a8.content.ptr;
  if ((void **)local_a8.content.ptr != (void **)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar2,1,sVar4,sVar4,0);
  }
  sVar4 = local_88.content.size_;
  pcVar2 = local_88.content.ptr;
  if (local_88.content.ptr != (char *)0x0) {
    local_88.content.ptr = (char *)0x0;
    local_88.content.size_ = 0;
    (**(local_88.content.disposer)->_vptr_ArrayDisposer)
              (local_88.content.disposer,pcVar2,1,sVar4,sVar4,0);
  }
  return;
}

Assistant:

void logException(LogSeverity severity, Exception&& e) {
    // We intentionally go back to the top exception callback on the stack because we don't want to
    // bypass whatever log processing is in effect.
    //
    // We intentionally don't log the context since it should get re-added by the exception callback
    // anyway.
    getExceptionCallback().logMessage(severity, e.getFile(), e.getLine(), 0, str(
        e.getType(), e.getDescription() == nullptr ? "" : ": ", e.getDescription(),
        e.getStackTrace().size() > 0 ? "\nstack: " : "",
        stringifyStackTraceAddresses(e.getStackTrace()),
        stringifyStackTrace(e.getStackTrace()), "\n"));
  }